

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O1

int stbi__mad3sizes_valid(int a,int b,int c,int add)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((-1 < (b | a)) && ((b == 0 || (uVar2 = 0, a <= (int)(0x7fffffff / (ulong)(uint)b))))) {
    uVar1 = b * a;
    uVar2 = 0;
    if ((-1 < (int)(uVar1 | c)) &&
       ((c == 0 || (uVar2 = 0, (int)uVar1 <= (int)(0x7fffffff / (ulong)(uint)c))))) {
      uVar2 = (uint)((int)(uVar1 * c) <= (int)(add ^ 0x7fffffffU));
    }
  }
  return uVar2;
}

Assistant:

static int stbi__mad3sizes_valid(int a, int b, int c, int add)
{
   return stbi__mul2sizes_valid(a, b) && stbi__mul2sizes_valid(a*b, c) &&
      stbi__addsizes_valid(a*b*c, add);
}